

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_funcinfo(lua_State *L)

{
  uint32_t *puVar1;
  uint pc_00;
  GCproto *pt_00;
  GCtab *t_00;
  char *name;
  lua_State *L_00;
  TValue *pTVar2;
  long in_RDI;
  GCtab *t_1;
  GCfunc *fn;
  GCtab *t;
  BCPos pc;
  GCproto *pt;
  undefined8 in_stack_ffffffffffffff68;
  int b;
  lua_State *in_stack_ffffffffffffff70;
  lua_State *in_stack_ffffffffffffff78;
  lua_State *in_stack_ffffffffffffff80;
  BCPos pc_01;
  GCproto *in_stack_ffffffffffffff88;
  lua_State *in_stack_ffffffffffffff90;
  lua_State *in_stack_ffffffffffffff98;
  GCtab *t_01;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  pt_00 = check_Lproto(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (pt_00 == (GCproto *)0x0) {
    name = (char *)(ulong)**(uint **)(in_RDI + 0x10);
    lua_createtable(in_stack_ffffffffffffff98,0,**(uint **)(in_RDI + 0x10));
    L_00 = (lua_State *)(ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8);
    if (name[6] != '\x01') {
      setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  (GCtab *)in_stack_ffffffffffffff98,name,0);
    }
    lj_str_new((lua_State *)pt_00,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (size_t)in_stack_ffffffffffffff98);
    pTVar2 = lj_tab_setstr(L_00,(GCtab *)in_stack_ffffffffffffff80,
                           (GCstr *)in_stack_ffffffffffffff78);
    pTVar2->n = (double)*(long *)(name + 0x18);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                (GCtab *)in_stack_ffffffffffffff98,name,(int32_t)((ulong)L_00 >> 0x20));
  }
  else {
    pc_00 = lj_lib_optint(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (int32_t)in_stack_ffffffffffffff78);
    pc_01 = (BCPos)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    lua_createtable(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                    (int)in_stack_ffffffffffffff90);
    t_00 = (GCtab *)(ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8);
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_00,
                (char *)in_stack_ffffffffffffff90,
                (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    t_01 = t_00;
    if (pc_00 < pt_00->sizebc) {
      lj_debug_line(pt_00,pc_00);
      pc_01 = (BCPos)((ulong)t_00 >> 0x20);
      setintfield((lua_State *)CONCAT44(pc_00,in_stack_ffffffffffffffa0),t_01,
                  (char *)in_stack_ffffffffffffff90,
                  (int32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    }
    b = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    lua_pushboolean(in_stack_ffffffffffffff70,b);
    lua_setfield((lua_State *)pt_00,pc_00,(char *)t_01);
    lua_pushboolean(in_stack_ffffffffffffff70,b);
    lua_setfield((lua_State *)pt_00,pc_00,(char *)t_01);
    puVar1 = *(uint32_t **)(in_RDI + 0x18);
    *(uint32_t **)(in_RDI + 0x18) = puVar1 + 2;
    *puVar1 = (pt_00->chunkname).gcptr32;
    puVar1[1] = 0xfffffffb;
    lua_setfield((lua_State *)pt_00,pc_00,(char *)t_01);
    lj_debug_pushloc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,pc_01);
    lua_setfield((lua_State *)pt_00,pc_00,(char *)t_01);
  }
  return 1;
}

Assistant:

LJLIB_CF(jit_util_funcinfo)
{
  GCproto *pt = check_Lproto(L, 1);
  if (pt) {
    BCPos pc = (BCPos)lj_lib_optint(L, 2, 0);
    GCtab *t;
    lua_createtable(L, 0, 16);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "linedefined", pt->firstline);
    setintfield(L, t, "lastlinedefined", pt->firstline + pt->numline);
    setintfield(L, t, "stackslots", pt->framesize);
    setintfield(L, t, "params", pt->numparams);
    setintfield(L, t, "bytecodes", (int32_t)pt->sizebc);
    setintfield(L, t, "gcconsts", (int32_t)pt->sizekgc);
    setintfield(L, t, "nconsts", (int32_t)pt->sizekn);
    setintfield(L, t, "upvalues", (int32_t)pt->sizeuv);
    if (pc < pt->sizebc)
      setintfield(L, t, "currentline", lj_debug_line(pt, pc));
    lua_pushboolean(L, (pt->flags & PROTO_VARARG));
    lua_setfield(L, -2, "isvararg");
    lua_pushboolean(L, (pt->flags & PROTO_CHILD));
    lua_setfield(L, -2, "children");
    setstrV(L, L->top++, proto_chunkname(pt));
    lua_setfield(L, -2, "source");
    lj_debug_pushloc(L, pt, pc);
    lua_setfield(L, -2, "loc");
  } else {
    GCfunc *fn = funcV(L->base);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    if (!iscfunc(fn))
      setintfield(L, t, "ffid", fn->c.ffid);
    setintptrV(lj_tab_setstr(L, t, lj_str_newlit(L, "addr")),
	       (intptr_t)(void *)fn->c.f);
    setintfield(L, t, "upvalues", fn->c.nupvalues);
  }
  return 1;
}